

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11TextureCalc.h
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmGen11TextureCalc::GmmTexGetMipDepth
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  byte bVar1;
  uint local_2c;
  uint local_28;
  uint32_t MipLevel_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen11TextureCalc *this_local;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = (byte)MipLevel;
    if (((ulong)(pTexInfo->Flags).Info >> 4 & 1) == 0) {
      if (pTexInfo->Depth >> (bVar1 & 0x1f) == 0) {
        local_28 = 1;
      }
      else {
        local_28 = pTexInfo->Depth >> (bVar1 & 0x1f);
      }
      this_local._4_4_ = local_28;
    }
    else if (pTexInfo->Depth == 1) {
      this_local._4_4_ = pTexInfo->Depth;
    }
    else {
      if (pTexInfo->Depth - 1 >> (bVar1 & 0x1f) == 0) {
        local_2c = 1;
      }
      else {
        local_2c = pTexInfo->Depth - 1 >> (bVar1 & 0x1f);
      }
      this_local._4_4_ = local_2c + 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

virtual uint32_t  GmmTexGetMipDepth(GMM_TEXTURE_INFO *pTexInfo, uint32_t MipLevel)
            {
                __GMM_ASSERTPTR(pTexInfo, 0);

                if (!pTexInfo->Flags.Info.CornerTexelMode)
                {
                    return(GFX_MAX(1, pTexInfo->Depth >> MipLevel));
                }
                else
                {
                    if (pTexInfo->Depth == 1)
                    {
                        return pTexInfo->Depth;
                    }
                    else
                    {
                        return(GFX_MAX(1, (pTexInfo->Depth - 1) >> MipLevel) + 1);
                    }
                }
            }